

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O2

string * __thiscall
pbrt::BlackbodySpectrum::ToString_abi_cxx11_(string *__return_storage_ptr__,BlackbodySpectrum *this)

{
  float *in_RCX;
  
  StringPrintf<float_const&>
            (__return_storage_ptr__,(pbrt *)"[ BlackbodySpectrum T: %f ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string BlackbodySpectrum::ToString() const {
    return StringPrintf("[ BlackbodySpectrum T: %f ]", T);
}